

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cpp
# Opt level: O2

bool __thiscall Filesystem::add_fcb(Filesystem *this,int firstId,Fcb fcb)

{
  Fat *pFVar1;
  int iVar2;
  Document *this_00;
  ostream *poVar3;
  uint uVar4;
  
  pFVar1 = this->pfat1;
  if (pFVar1->filelist[firstId] == 0) {
    pFVar1->filelist[firstId] = 0xffff;
  }
  do {
    uVar4 = firstId;
    firstId = (uint)pFVar1->filelist[(int)uVar4];
  } while (pFVar1->filelist[(int)uVar4] != 0xffff);
  this_00 = (Document *)operator_new(0x20);
  Document::Document(this_00,this->blocks[(int)uVar4]);
  if ((ulong)((long)(this_00->fcbList).super__Vector_base<Fcb,_std::allocator<Fcb>_>._M_impl.
                    super__Vector_impl_data._M_finish +
             (-0x3d8 - (long)(this_00->fcbList).super__Vector_base<Fcb,_std::allocator<Fcb>_>.
                             _M_impl.super__Vector_impl_data._M_start)) < 0xfffffffffffffc00) {
    iVar2 = Fat::get_FreeBlock(this->pfat1);
    if (iVar2 == -1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"[Err]Current content is full!");
      std::endl<char,std::char_traits<char>>(poVar3);
      return false;
    }
    pFVar1 = this->pfat1;
    pFVar1->filelist[(int)uVar4] = (Filelist)iVar2;
    pFVar1->filelist[iVar2] = 0xffff;
    Document::~Document(this_00);
    operator_delete(this_00,0x20);
    this_00 = (Document *)operator_new(0x20);
    Document::Document(this_00,this->blocks[(int)uVar4]);
  }
  std::vector<Fcb,_std::allocator<Fcb>_>::push_back(&this_00->fcbList,&fcb);
  Document::~Document(this_00);
  operator_delete(this_00,0x20);
  return true;
}

Assistant:

bool Filesystem::add_fcb(int firstId,Fcb fcb)
{
    ///Step1
    int lastId = firstId;
    if ((*pfat1)[lastId]== FREE)
    {
        (*pfat1)[lastId]= END;
    }
    while ((*pfat1)[lastId] != END) {
        lastId = (*pfat1)[lastId];
    }
    Document* plastDoc = new Document(blocks[lastId]);

    if((plastDoc->fcbList.size()+1)*sizeof(Fcb)>= BLOCKSIZE)
    {
        int freeBlock = pfat1->get_FreeBlock();
        if (freeBlock==FULL)
        {
            cout << "[Err]Current content is full!"<<endl;
            return false;
        }
        (*pfat1)[lastId] = freeBlock;
        (*pfat1)[freeBlock] = END;
        delete plastDoc;
        plastDoc = new Document(blocks[lastId]);
    ///Step2
        plastDoc->fcbList.push_back(fcb);
    }
    else
    {
        plastDoc->fcbList.push_back(fcb);
    }
#ifdef DEBUG
    //cout << "size:" << plastDoc->fcbList.size()<<endl;
    //cout << plastDoc->fcbList[0].filename<<endl;
#endif

    delete plastDoc;
    return true;

}